

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O1

s3pid_t mdef_phone_id_nearest(mdef_t *m,s3cipid_t b,s3cipid_t l,s3cipid_t r,word_posn_t pos)

{
  short sVar1;
  int iVar2;
  short lc;
  short rc;
  int iVar3;
  s3pid_t sVar4;
  int iVar5;
  word_posn_t wVar6;
  
  if (m == (mdef_t *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                  ,0x14d,
                  "s3pid_t mdef_phone_id_nearest(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
                 );
  }
  if (-1 < b) {
    iVar5 = (int)b;
    iVar2 = m->n_ciphone;
    if (iVar5 < iVar2) {
      if (WORD_POSN_SINGLE < pos) {
        __assert_fail("(pos >= 0) && (pos < N_WORD_POSN)",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                      ,0x14f,
                      "s3pid_t mdef_phone_id_nearest(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
                     );
      }
      iVar3 = iVar5;
      if (-1 < (short)(r | l)) {
        if (iVar2 <= l) {
          __assert_fail("(l >= 0) && (l < m->n_ciphone)",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                        ,0x154,
                        "s3pid_t mdef_phone_id_nearest(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
                       );
        }
        if (iVar2 <= r) {
          __assert_fail("(r >= 0) && (r < m->n_ciphone)",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                        ,0x155,
                        "s3pid_t mdef_phone_id_nearest(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
                       );
        }
        iVar3 = mdef_phone_id(m,b,l,r,pos);
        if (iVar3 < 0) {
          wVar6 = WORD_POSN_INTERNAL;
          do {
            if ((pos != wVar6) && (sVar4 = mdef_phone_id(m,b,l,r,wVar6), -1 < sVar4)) {
              return sVar4;
            }
            wVar6 = wVar6 + WORD_POSN_BEGIN;
          } while (wVar6 != WORD_POSN_UNDEFINED);
          sVar1 = m->sil;
          iVar3 = iVar5;
          if (-1 < sVar1) {
            lc = sVar1;
            if (m->ciphone[(uint)(int)l].filler == 0) {
              lc = l;
            }
            rc = r;
            if (m->ciphone[(uint)(int)r].filler != 0) {
              rc = sVar1;
            }
            if (((lc != l) || (rc != r)) && (iVar3 = mdef_phone_id(m,b,lc,rc,pos), iVar3 < 0)) {
              wVar6 = WORD_POSN_INTERNAL;
              do {
                if ((pos != wVar6) && (sVar4 = mdef_phone_id(m,b,lc,rc,wVar6), -1 < sVar4)) {
                  return sVar4;
                }
                wVar6 = wVar6 + WORD_POSN_BEGIN;
                iVar3 = iVar5;
              } while (wVar6 != WORD_POSN_UNDEFINED);
            }
          }
        }
      }
      return iVar3;
    }
  }
  __assert_fail("(b >= 0) && (b < m->n_ciphone)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                ,0x14e,
                "s3pid_t mdef_phone_id_nearest(mdef_t *, s3cipid_t, s3cipid_t, s3cipid_t, word_posn_t)"
               );
}

Assistant:

s3pid_t
mdef_phone_id_nearest(mdef_t * m,
                      s3cipid_t b, s3cipid_t l, s3cipid_t r,
                      word_posn_t pos)
{
    word_posn_t tmppos;
    s3pid_t p;
    s3cipid_t newl, newr;
    char *wpos_name;

    assert(m);
    assert((b >= 0) && (b < m->n_ciphone));
    assert((pos >= 0) && (pos < N_WORD_POSN));

    if ((NOT_S3CIPID(l)) || (NOT_S3CIPID(r)))
        return ((s3pid_t) b);

    assert((l >= 0) && (l < m->n_ciphone));
    assert((r >= 0) && (r < m->n_ciphone));

    p = mdef_phone_id(m, b, l, r, pos);
    if (IS_S3PID(p))
        return p;

    /* Exact triphone not found; backoff to other word positions */
    for (tmppos = 0; tmppos < N_WORD_POSN; tmppos++) {
        if (tmppos != pos) {
            p = mdef_phone_id(m, b, l, r, tmppos);
            if (IS_S3PID(p))
                return p;
        }
    }

    /* Nothing yet; backoff to silence phone if non-silence filler context */
    if (IS_S3CIPID(m->sil)) {
        newl = m->ciphone[(int) l].filler ? m->sil : l;
        newr = m->ciphone[(int) r].filler ? m->sil : r;
        if ((newl != l) || (newr != r)) {
            p = mdef_phone_id(m, b, newl, newr, pos);
            if (IS_S3PID(p))
                return p;

            for (tmppos = 0; tmppos < N_WORD_POSN; tmppos++) {
                if (tmppos != pos) {
                    p = mdef_phone_id(m, b, newl, newr, tmppos);
                    if (IS_S3PID(p))
                        return p;
                }
            }
        }
    }

    /* Nothing yet; backoff to base phone */
    if ((m->n_phone > m->n_ciphone) && (!m->ciphone[(int) b].filler)) {
        wpos_name = WPOS_NAME;
#if 0
        E_WARN("Triphone(%s,%s,%s,%c) not found; backing off to CIphone\n",
               mdef_ciphone_str(m, b),
               mdef_ciphone_str(m, l),
               mdef_ciphone_str(m, r), wpos_name[pos]);
#endif
    }
    return ((s3pid_t) b);
}